

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_set_implemented(lys_module *module)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  lys_revision *plVar4;
  char *pcVar5;
  unres_schema *local_30;
  unres_schema *unres;
  
  if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_set_implemented");
    iVar3 = 1;
  }
  else {
    if ((module->field_0x40 & 1) != 0) {
      module = (lys_module *)module->data;
    }
    uVar1 = *(ushort *)&module->field_0x40;
    if ((uVar1 & 0x40) != 0) {
      lys_set_enabled(module);
    }
    uVar2 = *(ushort *)&module->field_0x40;
    iVar3 = 0;
    if (-1 < (char)uVar2) {
      local_30 = (unres_schema *)calloc(1,0x28);
      if (local_30 == (unres_schema *)0x0) {
        iVar3 = 1;
        ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_set_implemented"
              );
        if ((uVar1 & 0x40) != 0) {
          lys_set_disabled(module);
        }
      }
      else {
        *(ushort *)&module->field_0x40 = uVar2 | 0x80;
        iVar3 = lys_make_implemented_r(module,local_30);
        if ((iVar3 == 0) &&
           ((local_30->count == 0 || (iVar3 = resolve_unres_schema(module,local_30), iVar3 == 0))))
        {
          iVar3 = 0;
          unres_schema_free((lys_module *)0x0,&local_30,0);
          plVar4 = (lys_revision *)0x1a4a36;
          pcVar5 = "@";
          if (module->rev_size == '\0') {
            pcVar5 = "";
          }
          else {
            plVar4 = module->rev;
          }
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Module \"%s%s%s\" now implemented.",module->name
                 ,pcVar5,plVar4);
        }
        else {
          if ((uVar1 & 0x40) != 0) {
            lys_set_disabled(module);
          }
          module->field_0x40 = module->field_0x40 & 0x7f;
          iVar3 = 1;
          unres_schema_free(module,&local_30,1);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

API int
lys_set_implemented(const struct lys_module *module)
{
    struct unres_schema *unres;
    int disabled = 0;

    if (!module) {
        LOGARG;
        return EXIT_FAILURE;
    }

    module = lys_main_module(module);

    if (module->disabled) {
        disabled = 1;
        lys_set_enabled(module);
    }

    if (module->implemented) {
        return EXIT_SUCCESS;
    }

    unres = calloc(1, sizeof *unres);
    if (!unres) {
        LOGMEM(module->ctx);
        if (disabled) {
            /* set it back disabled */
            lys_set_disabled(module);
        }
        return EXIT_FAILURE;
    }
    /* recursively make the module implemented */
    ((struct lys_module *)module)->implemented = 1;
    if (lys_make_implemented_r((struct lys_module *)module, unres)) {
        goto error;
    }

    /* try again resolve augments in other modules possibly augmenting this one,
     * since we have just enabled it
     */
    /* resolve rest of unres items */
    if (unres->count && resolve_unres_schema((struct lys_module *)module, unres)) {
        goto error;
    }
    unres_schema_free(NULL, &unres, 0);

    LOGVRB("Module \"%s%s%s\" now implemented.", module->name, (module->rev_size ? "@" : ""),
           (module->rev_size ? module->rev[0].date : ""));
    return EXIT_SUCCESS;

error:
    if (disabled) {
        /* set it back disabled */
        lys_set_disabled(module);
    }

    ((struct lys_module *)module)->implemented = 0;
    unres_schema_free((struct lys_module *)module, &unres, 1);
    return EXIT_FAILURE;
}